

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlschemas.c
# Opt level: O3

int xmlSchemaValidateFacets
              (xmlSchemaAbstractCtxtPtr actxt,xmlNodePtr node,xmlSchemaTypePtr type,
              xmlSchemaValType valType,xmlChar *value,xmlSchemaValPtr val,unsigned_long length,
              int fireErrors)

{
  xmlSchemaTypePtr *ppxVar1;
  bool bVar2;
  xmlParserErrors xVar3;
  int iVar4;
  xmlSchemaTypePtr pxVar5;
  char *message;
  xmlSchemaFacetPtr pxVar6;
  xmlSchemaValPtr pxVar7;
  _xmlSchemaFacetLink *p_Var8;
  xmlSchemaFacetLinkPtr pxVar9;
  unsigned_long len;
  char *in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa8;
  xmlParserErrors xVar10;
  xmlSchemaWhitespaceValueType local_44;
  xmlSchemaValPtr local_38;
  
  local_38 = (xmlSchemaValPtr)0x0;
  if (type->type == XML_SCHEMA_TYPE_BASIC) {
    return 0;
  }
  p_Var8 = type->facetSet;
  pxVar7 = (xmlSchemaValPtr)value;
  if (p_Var8 == (xmlSchemaFacetLinkPtr)0x0) {
    xVar10 = XML_ERR_OK;
    goto LAB_001a3022;
  }
  pxVar5 = type;
  if (((uint)type->flags >> 8 & 1) == 0) {
    xVar10 = XML_ERR_OK;
    if ((type->flags & 0x40U) == 0) goto LAB_001a3022;
  }
  else {
    do {
      if (pxVar5->builtInType == 0x2e) {
        iVar4 = 0x2e;
        goto LAB_001a2ea5;
      }
      iVar4 = pxVar5->builtInType;
      if ((pxVar5->flags & 0x4000) != 0) goto LAB_001a2e99;
      ppxVar1 = &pxVar5->baseType;
      pxVar5 = *ppxVar1;
    } while (*ppxVar1 != (xmlSchemaTypePtr)0x0);
    pxVar5 = (xmlSchemaTypePtr)0x0;
    iVar4 = _DAT_000000a0;
LAB_001a2e99:
    if (iVar4 == 1) {
LAB_001a2eb7:
      local_44 = xmlSchemaGetWhiteSpaceFacetValue(type);
    }
    else {
LAB_001a2ea5:
      local_44 = XML_SCHEMA_WHITESPACE_COLLAPSE;
      if ((iVar4 == 0x2e) && (pxVar5->type == XML_SCHEMA_TYPE_BASIC)) goto LAB_001a2eb7;
    }
    if (val != (xmlSchemaValPtr)0x0) {
      valType = xmlSchemaGetValType(val);
      p_Var8 = type->facetSet;
    }
    if (p_Var8 == (xmlSchemaFacetLinkPtr)0x0) {
      xVar10 = XML_ERR_OK;
    }
    else {
      xVar10 = XML_ERR_OK;
      do {
        pxVar6 = p_Var8->facet;
        if (2 < pxVar6->type - XML_SCHEMA_FACET_PATTERN) {
          if (pxVar6->type - XML_SCHEMA_FACET_LENGTH < 3) {
            pxVar7 = (xmlSchemaValPtr)&local_38;
            xVar3 = xmlSchemaValidateLengthFacetWhtsp
                              (pxVar6,valType,value,val,(unsigned_long *)pxVar7,local_44);
          }
          else {
            pxVar7 = val;
            xVar3 = xmlSchemaValidateFacetWhtsp(pxVar6,local_44,valType,value,val,local_44);
          }
          if ((int)xVar3 < 0) {
            message = "validating against a atomic type facet";
            goto LAB_001a3185;
          }
          if (xVar3 != XML_ERR_OK) {
            if (fireErrors == 0) {
              return xVar3;
            }
            pxVar7 = local_38;
            xmlSchemaFacetErr(actxt,xVar3,node,value,(unsigned_long)local_38,type,p_Var8->facet,
                              in_stack_ffffffffffffffa0,
                              (xmlChar *)CONCAT44(xVar10,in_stack_ffffffffffffffa8),(xmlChar *)actxt
                             );
            if (xVar10 == XML_ERR_OK) {
              xVar10 = xVar3;
            }
          }
        }
        p_Var8 = p_Var8->next;
      } while (p_Var8 != (_xmlSchemaFacetLink *)0x0);
    }
  }
  if ((type->flags & 0x40) != 0) {
    for (pxVar9 = type->facetSet; pxVar9 != (xmlSchemaFacetLinkPtr)0x0; pxVar9 = pxVar9->next) {
      if (pxVar9->facet->type - XML_SCHEMA_FACET_LENGTH < 3) {
        xVar3 = xmlSchemaValidateListSimpleTypeFacet
                          (pxVar9->facet,value,length,(unsigned_long *)0x0);
        if ((int)xVar3 < 0) {
          message = "validating against a list type facet";
LAB_001a3185:
          xmlSchemaInternalErr2
                    (actxt,"xmlSchemaValidateFacets",message,(xmlChar *)0x0,(xmlChar *)pxVar7);
          return -1;
        }
        if (xVar3 != XML_ERR_OK) {
          if (fireErrors == 0) {
            return xVar3;
          }
          pxVar7 = (xmlSchemaValPtr)length;
          xmlSchemaFacetErr(actxt,xVar3,node,value,length,type,pxVar9->facet,
                            in_stack_ffffffffffffffa0,
                            (xmlChar *)CONCAT44(xVar10,in_stack_ffffffffffffffa8),(xmlChar *)actxt);
          if (xVar10 == XML_ERR_OK) {
            xVar10 = xVar3;
          }
        }
      }
    }
  }
LAB_001a3022:
  pxVar5 = type;
  do {
    pxVar6 = pxVar5->facets;
    if (pxVar6 != (xmlSchemaFacetPtr)0x0) {
      bVar2 = true;
      do {
        while (pxVar6->type == XML_SCHEMA_FACET_ENUMERATION) {
          iVar4 = xmlSchemaAreValuesEqual(pxVar6->val,val);
          if (iVar4 == 1) {
            iVar4 = 1;
            goto LAB_001a30cd;
          }
          if (iVar4 < 0) {
            message = "validating against an enumeration facet";
            goto LAB_001a3185;
          }
          pxVar6 = pxVar6->next;
          bVar2 = false;
          if (pxVar6 == (_xmlSchemaFacet *)0x0) goto LAB_001a3084;
        }
        pxVar6 = pxVar6->next;
      } while (pxVar6 != (_xmlSchemaFacet *)0x0);
      if (!bVar2) {
LAB_001a3084:
        if (fireErrors == 0) {
          return 0x730;
        }
        pxVar7 = (xmlSchemaValPtr)0x0;
        xmlSchemaFacetErr(actxt,XML_SCHEMAV_CVC_ENUMERATION_VALID,node,value,0,type,
                          (xmlSchemaFacetPtr)0x0,in_stack_ffffffffffffffa0,
                          (xmlChar *)CONCAT44(xVar10,in_stack_ffffffffffffffa8),(xmlChar *)actxt);
        iVar4 = 0x730;
        if (xVar10 == XML_ERR_OK) {
          xVar10 = XML_SCHEMAV_CVC_ENUMERATION_VALID;
        }
LAB_001a30cd:
        pxVar6 = (xmlSchemaFacetPtr)0x0;
        pxVar5 = type;
        do {
          pxVar9 = pxVar5->facetSet;
          if (pxVar9 != (xmlSchemaFacetLinkPtr)0x0) {
            bVar2 = false;
            do {
              if (pxVar9->facet->type == XML_SCHEMA_FACET_PATTERN) {
                iVar4 = xmlRegexpExec(pxVar9->facet->regexp,value);
                if (iVar4 == 1) {
                  iVar4 = 1;
                  goto LAB_001a3129;
                }
                if (iVar4 < 0) {
                  message = "validating against a pattern facet";
                  goto LAB_001a3185;
                }
                pxVar6 = pxVar9->facet;
                bVar2 = true;
              }
              pxVar9 = pxVar9->next;
            } while (pxVar9 != (_xmlSchemaFacetLink *)0x0);
            if ((bVar2) && (iVar4 != 1)) {
              if (fireErrors == 0) {
                return 0x72f;
              }
              xmlSchemaFacetErr(actxt,XML_SCHEMAV_CVC_PATTERN_VALID,node,value,0,type,pxVar6,
                                in_stack_ffffffffffffffa0,
                                (xmlChar *)CONCAT44(xVar10,in_stack_ffffffffffffffa8),
                                (xmlChar *)actxt);
              if (xVar10 != XML_ERR_OK) {
                return xVar10;
              }
              return 0x72f;
            }
          }
LAB_001a3129:
          pxVar5 = pxVar5->baseType;
          if (pxVar5 == (xmlSchemaTypePtr)0x0) {
            return xVar10;
          }
          if (pxVar5->type == XML_SCHEMA_TYPE_BASIC) {
            return xVar10;
          }
        } while( true );
      }
    }
    pxVar5 = pxVar5->baseType;
    iVar4 = 0;
    if ((pxVar5 == (xmlSchemaTypePtr)0x0) || (iVar4 = 0, pxVar5->type == XML_SCHEMA_TYPE_BASIC))
    goto LAB_001a30cd;
  } while( true );
}

Assistant:

static int
xmlSchemaValidateFacets(xmlSchemaAbstractCtxtPtr actxt,
			xmlNodePtr node,
			xmlSchemaTypePtr type,
			xmlSchemaValType valType,
			const xmlChar * value,
			xmlSchemaValPtr val,
			unsigned long length,
			int fireErrors)
{
    int ret, error = 0, found;

    xmlSchemaTypePtr tmpType;
    xmlSchemaFacetLinkPtr facetLink;
    xmlSchemaFacetPtr facet;
    unsigned long len = 0;
    xmlSchemaWhitespaceValueType ws;

    /*
    * In Libxml2, derived built-in types have currently no explicit facets.
    */
    if (type->type == XML_SCHEMA_TYPE_BASIC)
	return (0);

    /*
    * NOTE: Do not jump away, if the facetSet of the given type is
    * empty: until now, "pattern" and "enumeration" facets of the
    * *base types* need to be checked as well.
    */
    if (type->facetSet == NULL)
	goto pattern_and_enum;

    if (! WXS_IS_ATOMIC(type)) {
	if (WXS_IS_LIST(type))
	    goto WXS_IS_LIST;
	else
	    goto pattern_and_enum;
    }

    /*
    * Whitespace handling is only of importance for string-based
    * types.
    */
    tmpType = xmlSchemaGetPrimitiveType(type);
    if ((tmpType->builtInType == XML_SCHEMAS_STRING) ||
	WXS_IS_ANY_SIMPLE_TYPE(tmpType)) {
	ws = xmlSchemaGetWhiteSpaceFacetValue(type);
    } else
	ws = XML_SCHEMA_WHITESPACE_COLLAPSE;

    /*
    * If the value was not computed (for string or
    * anySimpleType based types), then use the provided
    * type.
    */
    if (val != NULL)
	valType = xmlSchemaGetValType(val);

    ret = 0;
    for (facetLink = type->facetSet; facetLink != NULL;
	facetLink = facetLink->next) {
	/*
	* Skip the pattern "whiteSpace": it is used to
	* format the character content beforehand.
	*/
	switch (facetLink->facet->type) {
	    case XML_SCHEMA_FACET_WHITESPACE:
	    case XML_SCHEMA_FACET_PATTERN:
	    case XML_SCHEMA_FACET_ENUMERATION:
		continue;
	    case XML_SCHEMA_FACET_LENGTH:
	    case XML_SCHEMA_FACET_MINLENGTH:
	    case XML_SCHEMA_FACET_MAXLENGTH:
		ret = xmlSchemaValidateLengthFacetWhtsp(facetLink->facet,
		    valType, value, val, &len, ws);
		break;
	    default:
		ret = xmlSchemaValidateFacetWhtsp(facetLink->facet, ws,
		    valType, value, val, ws);
		break;
	}
	if (ret < 0) {
	    AERROR_INT("xmlSchemaValidateFacets",
		"validating against a atomic type facet");
	    return (-1);
	} else if (ret > 0) {
	    if (fireErrors)
		xmlSchemaFacetErr(actxt, ret, node,
		value, len, type, facetLink->facet, NULL, NULL, NULL);
	    else
		return (ret);
	    if (error == 0)
		error = ret;
	}
	ret = 0;
    }

WXS_IS_LIST:
    if (! WXS_IS_LIST(type))
	goto pattern_and_enum;
    /*
    * "length", "minLength" and "maxLength" of list types.
    */
    ret = 0;
    for (facetLink = type->facetSet; facetLink != NULL;
	facetLink = facetLink->next) {

	switch (facetLink->facet->type) {
	    case XML_SCHEMA_FACET_LENGTH:
	    case XML_SCHEMA_FACET_MINLENGTH:
	    case XML_SCHEMA_FACET_MAXLENGTH:
		ret = xmlSchemaValidateListSimpleTypeFacet(facetLink->facet,
		    value, length, NULL);
		break;
	    default:
		continue;
	}
	if (ret < 0) {
	    AERROR_INT("xmlSchemaValidateFacets",
		"validating against a list type facet");
	    return (-1);
	} else if (ret > 0) {
	    if (fireErrors)
		xmlSchemaFacetErr(actxt, ret, node,
		value, length, type, facetLink->facet, NULL, NULL, NULL);
	    else
		return (ret);
	    if (error == 0)
		error = ret;
	}
	ret = 0;
    }

pattern_and_enum:
    found = 0;
    /*
    * Process enumerations. Facet values are in the value space
    * of the defining type's base type. This seems to be a bug in the
    * XML Schema 1.0 spec. Use the whitespace type of the base type.
    * Only the first set of enumerations in the ancestor-or-self axis
    * is used for validation.
    */
    ret = 0;
    tmpType = type;
    do {
        for (facet = tmpType->facets; facet != NULL; facet = facet->next) {
            if (facet->type != XML_SCHEMA_FACET_ENUMERATION)
                continue;
            found = 1;
            ret = xmlSchemaAreValuesEqual(facet->val, val);
            if (ret == 1)
                break;
            else if (ret < 0) {
                AERROR_INT("xmlSchemaValidateFacets",
                    "validating against an enumeration facet");
                return (-1);
            }
        }
        if (ret != 0)
            break;
        /*
        * Break on the first set of enumerations. Any additional
        *  enumerations which might be existent on the ancestors
        *  of the current type are restricted by this set; thus
        *  *must* *not* be taken into account.
        */
        if (found)
            break;
        tmpType = tmpType->baseType;
    } while ((tmpType != NULL) &&
        (tmpType->type != XML_SCHEMA_TYPE_BASIC));
    if (found && (ret == 0)) {
        ret = XML_SCHEMAV_CVC_ENUMERATION_VALID;
        if (fireErrors) {
            xmlSchemaFacetErr(actxt, ret, node,
                value, 0, type, NULL, NULL, NULL, NULL);
        } else
            return (ret);
        if (error == 0)
            error = ret;
    }

    /*
    * Process patters. Pattern facets are ORed at type level
    * and ANDed if derived. Walk the base type axis.
    */
    tmpType = type;
    facet = NULL;
    do {
        found = 0;
        for (facetLink = tmpType->facetSet; facetLink != NULL;
            facetLink = facetLink->next) {
            if (facetLink->facet->type != XML_SCHEMA_FACET_PATTERN)
                continue;
            found = 1;
            /*
            * NOTE that for patterns, @value needs to be the
            * normalized value.
            */
            ret = xmlRegexpExec(facetLink->facet->regexp, value);
            if (ret == 1)
                break;
            else if (ret < 0) {
                AERROR_INT("xmlSchemaValidateFacets",
                    "validating against a pattern facet");
                return (-1);
            } else {
                /*
                * Save the last non-validating facet.
                */
                facet = facetLink->facet;
            }
        }
        if (found && (ret != 1)) {
            ret = XML_SCHEMAV_CVC_PATTERN_VALID;
            if (fireErrors) {
                xmlSchemaFacetErr(actxt, ret, node,
                    value, 0, type, facet, NULL, NULL, NULL);
            } else
                return (ret);
            if (error == 0)
                error = ret;
            break;
        }
        tmpType = tmpType->baseType;
    } while ((tmpType != NULL) && (tmpType->type != XML_SCHEMA_TYPE_BASIC));

    return (error);
}